

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

void HTS_ModelSet_get_parameter
               (HTS_ModelSet *ms,size_t stream_index,size_t state_index,char *string,double **iw,
               double *mean,double *vari,double *msd)

{
  double weight;
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar1 = (*ms->stream)[stream_index].num_windows * (*ms->stream)[stream_index].vector_length;
  if (lVar1 != 0) {
    lVar2 = 0;
    do {
      mean[lVar2] = 0.0;
      vari[lVar2] = 0.0;
      lVar2 = lVar2 + 1;
    } while (lVar1 - lVar2 != 0);
  }
  if (msd != (double *)0x0) {
    *msd = 0.0;
  }
  if (ms->num_voices != 0) {
    uVar3 = 0;
    do {
      weight = iw[uVar3][stream_index];
      if ((weight != 0.0) || (NAN(weight))) {
        HTS_Model_add_parameter
                  (ms->stream[uVar3] + stream_index,state_index,string,mean,vari,msd,weight);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < ms->num_voices);
  }
  return;
}

Assistant:

void HTS_ModelSet_get_parameter(HTS_ModelSet * ms, size_t stream_index, size_t state_index, const char *string, const double *const *iw, double *mean, double *vari, double *msd)
{
   size_t i;
   size_t len = ms->stream[0][stream_index].vector_length * ms->stream[0][stream_index].num_windows;

   for (i = 0; i < len; i++) {
      mean[i] = 0.0;
      vari[i] = 0.0;
   }
   if (msd != NULL)
      *msd = 0.0;

   for (i = 0; i < ms->num_voices; i++)
      if (iw[i][stream_index] != 0.0)
         HTS_Model_add_parameter(&ms->stream[i][stream_index], state_index, string, mean, vari, msd, iw[i][stream_index]);
}